

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

size_t __thiscall
gui::MultilineTextBox::findCaretOffset(MultilineTextBox *this,Vector2<unsigned_long> *caretPosition)

{
  long lVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  unsigned_long *in_RSI;
  long in_RDI;
  size_t i;
  size_t y;
  size_t pos;
  size_t local_38;
  size_type local_30;
  unsigned_long local_28;
  ulong local_20;
  long local_18;
  unsigned_long *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  sVar2 = std::vector<sf::String,_std::allocator<sf::String>_>::size
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328));
  local_28 = sVar2 - 1;
  puVar3 = std::min<unsigned_long>(in_RSI + 1,&local_28);
  local_20 = *puVar3;
  for (local_30 = 0; lVar1 = local_18, local_30 < local_20; local_30 = local_30 + 1) {
    std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
              ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_30);
    sVar4 = sf::String::getSize((String *)0x25ba6e);
    local_18 = sVar4 + 1 + local_18;
  }
  std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
            ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_20);
  local_38 = sf::String::getSize((String *)0x25babd);
  puVar3 = std::min<unsigned_long>(local_10,&local_38);
  return lVar1 + *puVar3;
}

Assistant:

size_t MultilineTextBox::findCaretOffset(const sf::Vector2<size_t>& caretPosition) const {
    size_t pos = 0;
    size_t y = std::min(caretPosition.y, boxStrings_.size() - 1);
    for (size_t i = 0; i < y; ++i) {
        pos += boxStrings_[i].getSize() + 1;
    }
    return pos + std::min(caretPosition.x, boxStrings_[y].getSize());
}